

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void server_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  PlugVtable *pPVar1;
  
  if (type != PLUGCLOSE_NORMAL) {
    ssh_remote_error((Ssh *)(plug + 0xc),"%s");
    return;
  }
  pPVar1 = plug[0xe].vt;
  if (pPVar1 != (PlugVtable *)0x0) {
    *(undefined1 *)&pPVar1->sent = 1;
    queue_idempotent_callback((IdempotentCallback *)&pPVar1[4].closing);
    return;
  }
  return;
}

Assistant:

static void server_closing(Plug *plug, PlugCloseType type,
                           const char *error_msg)
{
    server *srv = container_of(plug, server, plug);
    if (type != PLUGCLOSE_NORMAL) {
        ssh_remote_error(&srv->ssh, "%s", error_msg);
    } else if (srv->bpp) {
        srv->bpp->input_eof = true;
        queue_idempotent_callback(&srv->bpp->ic_in_raw);
    }
}